

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache.c
# Opt level: O1

int vmemcache_put(VMEMcache *cache,void *key,size_t ksize,void *value,size_t value_size)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  ulong uVar4;
  int *piVar5;
  cache_entry *entry;
  ptr_ext_t *ptr;
  ulong uVar6;
  size_t size;
  bool bVar7;
  ptr_ext_t *local_50;
  ptr_ext_t *small_extent;
  cache_entry *local_40;
  size_t local_38;
  
  local_38 = value_size;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_0010afc0);
  if ((((void *)*puVar3 != (void *)0x0) && (puVar3[1] == ksize)) &&
     (iVar1 = bcmp((void *)*puVar3,key,ksize), iVar1 == 0)) {
    *puVar3 = 0;
    uVar4 = local_38 - puVar3[4];
    if (local_38 < (ulong)puVar3[4] || uVar4 == 0) {
      puVar3[3] = 0;
    }
    else {
      if (uVar4 < (ulong)puVar3[3]) {
        puVar3[3] = uVar4;
      }
      if ((void *)puVar3[2] != (void *)0x0) {
        memcpy((void *)puVar3[2],value,puVar3[3]);
      }
    }
    if ((ulong *)puVar3[5] != (ulong *)0x0) {
      *(ulong *)puVar3[5] = local_38;
    }
  }
  if (cache->size < local_38) {
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
            0x152,"vmemcache_put","value larger than entire cache");
    piVar5 = __errno_location();
    *piVar5 = 0x1c;
  }
  else {
    entry = (cache_entry *)Zalloc(ksize + 0x28);
    if (entry != (cache_entry *)0x0) {
      (entry->key).ksize = ksize;
      memcpy(entry + 1,key,ksize);
      if ((cache->field_0x58 & 6) == 0) {
        local_50 = (ptr_ext_t *)0x0;
        small_extent = (ptr_ext_t *)&(entry->value).extents;
        size = local_38;
        local_40 = entry;
LAB_00104977:
        if (size != 0) goto code_r0x00104980;
        if ((cache->field_0x58 & 8) == 0) {
          ptr = (local_40->value).extents;
          uVar4 = vmcache_extent_get_size(ptr);
          uVar6 = local_38;
          while (ptr != (ptr_ext_t *)0x0) {
            if (uVar6 <= uVar4) {
              uVar4 = uVar6;
            }
            memcpy(ptr,value,uVar4);
            value = (void *)((long)value + uVar4);
            uVar6 = uVar6 - uVar4;
            ptr = vmcache_extent_get_next(ptr);
            uVar4 = vmcache_extent_get_size(ptr);
          }
        }
        (local_40->value).vsize = local_38;
        entry = local_40;
      }
      iVar1 = vmcache_index_insert(cache->index,entry);
      if (iVar1 == 0) {
        size = 0;
        if ((cache->field_0x58 & 2) == 0) {
          (*cache->repl->ops->repl_p_insert)(cache->repl->head,entry,&(entry->value).p_entry);
        }
        goto LAB_00104a06;
      }
      goto LAB_001049ea;
    }
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
            0x15b,"vmemcache_put","!Zalloc");
  }
LAB_00104a00:
  size = 0xffffffff;
LAB_00104a06:
  return (int)size;
code_r0x00104980:
  uVar4 = vmcache_alloc(cache->heap,size,(ptr_ext_t **)small_extent,&local_50);
  iVar1 = 7;
  if (-1 < (long)uVar4) {
    if ((uVar4 == 0) && (iVar2 = vmemcache_evict(cache,(void *)0x0,0), iVar2 != 0)) {
      piVar5 = __errno_location();
      if (*piVar5 == 3) {
        *piVar5 = 0x1c;
      }
    }
    else {
      iVar1 = 0;
      bVar7 = size < uVar4;
      size = size - uVar4;
      if (bVar7) {
        size = 0;
      }
    }
  }
  if (iVar1 != 0) goto LAB_001049dc;
  goto LAB_00104977;
LAB_001049dc:
  entry = local_40;
  if (iVar1 != 7) goto LAB_00104a06;
LAB_001049ea:
  vmcache_free(cache->heap,(entry->value).extents);
  free(entry);
  goto LAB_00104a00;
}

Assistant:

int
vmemcache_put(VMEMcache *cache, const void *key, size_t ksize,
				const void *value, size_t value_size)
{
	LOG(3, "cache %p key %p ksize %zu value %p value_size %zu",
		cache, key, ksize, value, value_size);

	if (get_req.key)
		vmemcache_put_satisfy_get(key, ksize, value, value_size);

	if (value_size > cache->size) {
		ERR("value larger than entire cache");
		errno = ENOSPC;
		return -1;
	}

	struct cache_entry *entry;

	entry = Zalloc(sizeof(struct cache_entry) + ksize);
	if (entry == NULL) {
		ERR("!Zalloc");
		return -1;
	}

	entry->key.ksize = ksize;
	memcpy(entry->key.key, key, ksize);

	if (cache->index_only || cache->no_alloc)
		goto put_index;

	ptr_ext_t *small_extent = NULL; /* required by vmcache_alloc() */
	size_t left_to_allocate = value_size;

	while (left_to_allocate != 0) {
		ssize_t allocated = vmcache_alloc(cache->heap, left_to_allocate,
							&entry->value.extents,
							&small_extent);
		if (allocated < 0)
			goto error_exit;

		if (allocated == 0 && vmemcache_evict(cache, NULL, 0)) {
			LOG(1, "vmemcache_evict() failed");
			if (errno == ESRCH)
				errno = ENOSPC;
			goto error_exit;
		}

		left_to_allocate -= MIN((size_t)allocated, left_to_allocate);
	}

	if (cache->no_memcpy)
		entry->value.vsize = value_size;
	else
		vmemcache_populate_extents(entry, value, value_size);

put_index:
	if (vmcache_index_insert(cache->index, entry)) {
		LOG(1, "inserting to the index failed");
		goto error_exit;
	}

	if (!cache->index_only) {
		cache->repl->ops->repl_p_insert(cache->repl->head, entry,
					&entry->value.p_entry);
	}

	return 0;

error_exit:
	vmcache_free(cache->heap, entry->value.extents);

	Free(entry);

	return -1;
}